

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_wstring_append_from_mbs(archive_wstring *dest,char *p,size_t len)

{
  archive_wstring *paVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  size_t sVar5;
  wchar_t *__pwc;
  wchar_t local_3c;
  mbstate_t_conflict shift_state;
  
  shift_state.__count = L'\0';
  shift_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  paVar1 = archive_wstring_ensure(dest,len + dest->length + 1);
  if (paVar1 == (archive_wstring *)0x0) {
LAB_003f9d7a:
    local_3c = L'\xffffffff';
  }
  else {
    __pwc = dest->s + dest->length;
    local_3c = L'\0';
    sVar5 = len;
    while( true ) {
      while( true ) {
        if ((*p == '\0') || (sVar5 == 0)) goto LAB_003f9d64;
        if (len == 0) {
          sVar2 = (long)__pwc - (long)dest->s >> 2;
          dest->length = sVar2;
          *__pwc = L'\0';
          paVar1 = archive_wstring_ensure(dest,sVar5 + sVar2 + 1);
          if (paVar1 == (archive_wstring *)0x0) goto LAB_003f9d7a;
          __pwc = dest->s + dest->length;
          len = sVar5;
        }
        sVar3 = mbrtowc(__pwc,p,len,(mbstate_t *)&shift_state);
        if (0xfffffffffffffffd < sVar3) break;
        if (sVar5 <= sVar3 - 1) goto LAB_003f9d64;
        __pwc = __pwc + 1;
        len = len - 1;
        p = p + sVar3;
        sVar5 = sVar5 - sVar3;
      }
      piVar4 = __errno_location();
      if (*piVar4 != 0x54) break;
      p = p + 1;
      sVar5 = sVar5 - 1;
      local_3c = L'\xffffffff';
    }
    local_3c = L'\xffffffff';
LAB_003f9d64:
    dest->length = (long)__pwc - (long)dest->s >> 2;
    *__pwc = L'\0';
  }
  return local_3c;
}

Assistant:

int
archive_wstring_append_from_mbs(struct archive_wstring *dest,
    const char *p, size_t len)
{
	size_t r;
	int ret_val = 0;
	/*
	 * No single byte will be more than one wide character,
	 * so this length estimate will always be big enough.
	 */
	size_t wcs_length = len;
	size_t mbs_length = len;
	const char *mbs = p;
	wchar_t *wcs;
#if HAVE_MBRTOWC
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#endif
	if (NULL == archive_wstring_ensure(dest, dest->length + wcs_length + 1))
		return (-1);
	wcs = dest->s + dest->length;
	/*
	 * We cannot use mbsrtowcs/mbstowcs here because those may convert
	 * extra MBS when strlen(p) > len and one wide character consis of
	 * multi bytes.
	 */
	while (*mbs && mbs_length > 0) {
		if (wcs_length == 0) {
			dest->length = wcs - dest->s;
			dest->s[dest->length] = L'\0';
			wcs_length = mbs_length;
			if (NULL == archive_wstring_ensure(dest,
			    dest->length + wcs_length + 1))
				return (-1);
			wcs = dest->s + dest->length;
		}
#if HAVE_MBRTOWC
		r = mbrtowc(wcs, mbs, wcs_length, &shift_state);
#else
		r = mbtowc(wcs, mbs, wcs_length);
#endif
		if (r == (size_t)-1 || r == (size_t)-2) {
			ret_val = -1;
			if (errno == EILSEQ) {
				++mbs;
				--mbs_length;
				continue;
			} else
				break;
		}
		if (r == 0 || r > mbs_length)
			break;
		wcs++;
		wcs_length--;
		mbs += r;
		mbs_length -= r;
	}
	dest->length = wcs - dest->s;
	dest->s[dest->length] = L'\0';
	return (ret_val);
}